

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall ON_Viewport::Read(ON_Viewport *this,ON_BinaryArchive *file)

{
  bool *__dest;
  bool *b_00;
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  view_projection vVar5;
  ON_Viewport *source_viewport;
  undefined4 uVar6;
  undefined4 uVar7;
  bool b;
  int minor_version;
  int i;
  int major_version;
  double scaleZ;
  double scaleY;
  double scaleX;
  bool local_65;
  int local_64;
  ON__INT32 local_60;
  int local_5c;
  double local_58;
  double local_50;
  ON_3dPoint local_48;
  
  source_viewport = &DefaultTopViewYUp;
  ON_Object::operator=((ON_Object *)this,(ON_Object *)&DefaultTopViewYUp);
  __dest = &this->m_bValidCamera;
  memcpy(__dest,&DefaultTopViewYUp.m_bValidCamera,0x220);
  *(undefined4 *)((this->m_projection_content_sha1).m_digest + 0x10) =
       DefaultTopViewYUp.m_projection_content_sha1.m_digest._16_4_;
  uVar2 = DefaultTopViewYUp.m_projection_content_sha1.m_digest._8_8_;
  *(undefined8 *)(this->m_projection_content_sha1).m_digest =
       DefaultTopViewYUp.m_projection_content_sha1.m_digest._0_8_;
  *(undefined8 *)((this->m_projection_content_sha1).m_digest + 8) = uVar2;
  this->m_bValidCamera = false;
  uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  this->m_bValidFrustum = false;
  this->m_bValidPort = false;
  this->m_bValidCameraFrame = false;
  *(undefined8 *)(this->m_projection_content_sha1).m_digest =
       ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
  *(undefined8 *)((this->m_projection_content_sha1).m_digest + 8) = uVar2;
  *(undefined4 *)((this->m_projection_content_sha1).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  local_5c = 0;
  local_64 = 1;
  bVar3 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_5c,&local_64);
  if (!bVar3) {
    return bVar3;
  }
  if (local_5c != 1) {
    return bVar3;
  }
  b_00 = &this->m_bValidCameraFrame;
  local_60 = 0;
  bVar3 = ON_BinaryArchive::ReadInt(file,&local_60);
  if (bVar3) {
    *__dest = local_60 != 0;
    *b_00 = local_60 != 0;
    bVar3 = ON_BinaryArchive::ReadInt(file,&local_60);
  }
  if (bVar3 != false) {
    this->m_bValidFrustum = local_60 != 0;
    bVar3 = ON_BinaryArchive::ReadInt(file,&local_60);
  }
  if (bVar3 != false) {
    this->m_bValidPort = local_60 != 0;
    bVar3 = ON_BinaryArchive::ReadInt(file,&local_60);
  }
  if (bVar3 != false) {
    vVar5 = ON::ViewProjection(local_60);
    this->m_projection = vVar5;
    bVar3 = ON_BinaryArchive::ReadPoint(file,&this->m_CamLoc);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadVector(file,&this->m_CamDir);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadVector(file,&this->m_CamUp);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadVector(file,&this->m_CamX);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadVector(file,&this->m_CamY);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadVector(file,&this->m_CamZ);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_left);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_right);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_bottom);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_top);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_near);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_far);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_port_left);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_port_right);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_port_bottom);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_port_top);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_port_near);
  }
  if (bVar3 != false) {
    bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_port_far);
  }
  if (*__dest != true) goto LAB_00672da9;
  local_48.z = (this->m_CamLoc).z;
  local_48.x = (this->m_CamLoc).x;
  local_48.y = (this->m_CamLoc).y;
  bVar4 = ON_3dPoint::IsValid(&local_48);
  uVar6 = 0x2594c37d;
  uVar7 = 0x54b249ad;
  if (bVar4) {
    dVar1 = ON_3dPoint::MaximumCoordinate(&local_48);
    uVar6 = SUB84(dVar1,0);
    uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  if ((1e+100 < (double)CONCAT44(uVar7,uVar6) || (double)CONCAT44(uVar7,uVar6) == 1e+100) ||
     ((double)CONCAT44(uVar7,uVar6) < 0.0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
               ,0x13c,"","ON_Viewport.m_bValidCamera in file was true and it should be false.");
    *__dest = false;
  }
  local_48.z = (this->m_CamUp).z;
  local_48.x = (this->m_CamUp).x;
  local_48.y = (this->m_CamUp).y;
  bVar4 = ON_3dVector::IsValid((ON_3dVector *)&local_48);
  uVar6 = 0;
  uVar7 = 0;
  if (bVar4) {
    dVar1 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&local_48);
    uVar6 = SUB84(dVar1,0);
    uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  if ((1e+100 < (double)CONCAT44(uVar7,uVar6) || (double)CONCAT44(uVar7,uVar6) == 1e+100) ||
     ((double)CONCAT44(uVar7,uVar6) < 2.3283064365386963e-10 ||
      (double)CONCAT44(uVar7,uVar6) == 2.3283064365386963e-10)) {
LAB_00672d5b:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
               ,0x141,"","ON_Viewport.m_bValidCamera in file was true and it should be false.");
    *__dest = false;
    *b_00 = false;
  }
  else {
    local_48.z = (this->m_CamDir).z;
    local_48.x = (this->m_CamDir).x;
    local_48.y = (this->m_CamDir).y;
    bVar4 = ON_3dVector::IsValid((ON_3dVector *)&local_48);
    uVar6 = 0;
    uVar7 = 0;
    if (bVar4) {
      dVar1 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&local_48);
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    if ((1e+100 < (double)CONCAT44(uVar7,uVar6) || (double)CONCAT44(uVar7,uVar6) == 1e+100) ||
       ((double)CONCAT44(uVar7,uVar6) < 2.3283064365386963e-10 ||
        (double)CONCAT44(uVar7,uVar6) == 2.3283064365386963e-10)) goto LAB_00672d5b;
  }
  if (*__dest == false) {
    if (this->m_projection == perspective_view) {
      source_viewport = &DefaultPerspectiveViewZUp;
    }
    SetCamera(this,source_viewport,true);
  }
LAB_00672da9:
  if ((((0 < local_64 & bVar3) == 1) &&
      (bVar3 = ON_BinaryArchive::ReadUuid(file,&this->m_viewport_id), bVar3)) && (1 < local_64)) {
    local_65 = false;
    bVar3 = ON_BinaryArchive::ReadBool(file,&local_65);
    if (bVar3) {
      this->m_bLockCamUp = local_65;
      local_65 = false;
      bVar3 = ON_BinaryArchive::ReadBool(file,&local_65);
    }
    else {
      local_65 = false;
    }
    if (bVar3 == false) {
      local_65 = false;
      bVar3 = false;
    }
    else {
      this->m_bLockCamDir = local_65;
      local_65 = false;
      bVar3 = ON_BinaryArchive::ReadBool(file,&local_65);
    }
    if (bVar3 == false) {
      local_65 = false;
      bVar3 = false;
    }
    else {
      this->m_bLockCamLoc = local_65;
      local_65 = false;
      bVar3 = ON_BinaryArchive::ReadBool(file,&local_65);
    }
    if (bVar3 == false) {
      local_65 = false;
      bVar3 = false;
    }
    else {
      this->m_frustum_symmetry_flags = local_65 * '\x02' | this->m_frustum_symmetry_flags & 0xfd;
      local_65 = false;
      bVar3 = ON_BinaryArchive::ReadBool(file,&local_65);
    }
    if (bVar3 != false) {
      this->m_frustum_symmetry_flags = this->m_frustum_symmetry_flags & 0xfe | local_65;
    }
    if ((((2 < local_64 & bVar3) == 1) &&
        (bVar3 = ON_BinaryArchive::ReadPoint(file,&this->m_target_point), bVar3)) &&
       ((3 < local_64 && ((bVar3 = ON_BinaryArchive::ReadBool(file,b_00), bVar3 && (4 < local_64))))
       )) {
      local_48.x = 1.0;
      local_50 = 1.0;
      local_58 = 1.0;
      bVar3 = ON_BinaryArchive::ReadDouble(file,&local_48.x);
      if (bVar3) {
        bVar3 = ON_BinaryArchive::ReadDouble(file,&local_50);
      }
      if (bVar3 != false) {
        bVar3 = ON_BinaryArchive::ReadDouble(file,&local_58);
      }
      if (bVar3 != false) {
        SetViewScale(this,local_48.x,local_50,local_58);
      }
    }
  }
  if (this->m_bValidFrustum == true) {
    bVar4 = ON_IsValid(this->m_frus_left);
    if (((((bVar4) && (bVar4 = ON_IsValid(this->m_frus_right), bVar4)) &&
         (bVar4 = ON_IsValid(this->m_frus_top), bVar4)) &&
        ((bVar4 = ON_IsValid(this->m_frus_bottom), bVar4 &&
         (bVar4 = ON_IsValid(this->m_frus_near), bVar4)))) &&
       (bVar4 = ON_IsValid(this->m_frus_far), bVar4)) {
      if (this->m_frus_left < this->m_frus_right) {
        if ((((this->m_frus_bottom < this->m_frus_top) && (0.0 < this->m_frus_near)) &&
            ((this->m_frus_far < 1e+100 &&
             (((this->m_frus_top < 1e+100 && (-1e+100 < this->m_frus_bottom)) &&
              (this->m_frus_right < 1e+100)))))) &&
           ((-1e+100 < this->m_frus_left && (this->m_frus_near < this->m_frus_far)))) {
          return bVar3;
        }
      }
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
               ,0x194,"","ON_Viewport.m_bValidFrustum in file was true and it should be false.");
    this->m_bValidFrustum = false;
  }
  return bVar3;
}

Assistant:

bool ON_Viewport::Read( ON_BinaryArchive& file )
{
  *this = ON_Viewport::DefaultTopViewYUp;

  m_bValidCamera = false;
  m_bValidFrustum = false;
  m_bValidPort = false;
  m_bValidCameraFrame = false;

  m_projection_content_sha1 = ON_SHA1_Hash::ZeroDigest;

  int major_version = 0;
  int minor_version = 1;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) 
  {
    // common to all 1.x versions
    int i=0;
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidCamera = (i?true:false);
    if (rc)
      m_bValidCameraFrame = m_bValidCamera;
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidFrustum = (i?true:false);
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidPort = (i?true:false);
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_projection = ON::ViewProjection(i);
    if (rc) rc = file.ReadPoint( m_CamLoc );
    if (rc) rc = file.ReadVector( m_CamDir );
    if (rc) rc = file.ReadVector( m_CamUp );
    if (rc) rc = file.ReadVector( m_CamX );
    if (rc) rc = file.ReadVector( m_CamY );
    if (rc) rc = file.ReadVector( m_CamZ );
    if (rc) rc = file.ReadDouble( &m_frus_left );
    if (rc) rc = file.ReadDouble( &m_frus_right );
    if (rc) rc = file.ReadDouble( &m_frus_bottom );
    if (rc) rc = file.ReadDouble( &m_frus_top );
    if (rc) rc = file.ReadDouble( &m_frus_near );
    if (rc) rc = file.ReadDouble( &m_frus_far );
    if (rc) rc = file.ReadInt( &m_port_left );
    if (rc) rc = file.ReadInt( &m_port_right );
    if (rc) rc = file.ReadInt( &m_port_bottom );
    if (rc) rc = file.ReadInt( &m_port_top );
    if (rc) rc = file.ReadInt( &m_port_near );
    if (rc) rc = file.ReadInt( &m_port_far );   

    if ( m_bValidCamera )
    {
      if ( !ON_Viewport::IsValidCameraLocation(m_CamLoc) )
      {
        ON_ERROR("ON_Viewport.m_bValidCamera in file was true and it should be false.");
        m_bValidCamera = false;
      }
      if ( !ON_Viewport::IsValidCameraUpOrDirection(m_CamUp) || !ON_Viewport::IsValidCameraUpOrDirection(m_CamDir) )
      {
        ON_ERROR("ON_Viewport.m_bValidCamera in file was true and it should be false.");
        m_bValidCamera = false;
        m_bValidCameraFrame = false;
      }
      if (!m_bValidCamera)
      {
        if (ON::view_projection::perspective_view == m_projection)
          SetCamera(ON_Viewport::DefaultPerspectiveViewZUp, true);
        else
          SetCamera(ON_Viewport::DefaultTopViewYUp, true);
      }
    }

    if (rc && minor_version >= 1 )
    {
      // 1.1 fields
      if (rc) rc = file.ReadUuid(m_viewport_id);

      if (rc && minor_version >= 2 )
      {
        // 1.2 fields 
        bool b;
        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraUpLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraDirectionLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraLocationLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetFrustumLeftRightSymmetry(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetFrustumTopBottomSymmetry(b);

        if (rc && minor_version >= 3 )
        {
          // added 18, June 2013 to V6
          rc = file.ReadPoint(m_target_point);

          if (rc && minor_version >= 4)
          {
            rc = file.ReadBool(&m_bValidCameraFrame);

            if (rc && minor_version >= 5)
            {
              double scaleX = 1, scaleY = 1, scaleZ = 1;
              rc = file.ReadDouble(&scaleX);
              if (rc) rc = file.ReadDouble(&scaleY);
              if (rc) rc = file.ReadDouble(&scaleZ);
              if (rc)
              {
                SetViewScale(scaleX, scaleY, scaleZ);
              }
            }
          }
        }
      }
    }

    if( m_bValidFrustum )
    {
      if (    !ON_IsValid(m_frus_left) || !ON_IsValid(m_frus_right)
           || !ON_IsValid(m_frus_top)  || !ON_IsValid(m_frus_bottom)
           || !ON_IsValid(m_frus_near) || !ON_IsValid(m_frus_far)
           || !(m_frus_left < m_frus_right)
           || !(m_frus_bottom < m_frus_top)
           || !(0.0 < m_frus_near)
           || !(m_frus_near < m_frus_far)
           || !(-ON_NONSENSE_WORLD_COORDINATE_VALUE < m_frus_left)
           || !(m_frus_right < ON_NONSENSE_WORLD_COORDINATE_VALUE)
           || !(-ON_NONSENSE_WORLD_COORDINATE_VALUE < m_frus_bottom)
           || !(m_frus_top < ON_NONSENSE_WORLD_COORDINATE_VALUE)
           || !(m_frus_far < ON_NONSENSE_WORLD_COORDINATE_VALUE)
         )
      {
        ON_ERROR("ON_Viewport.m_bValidFrustum in file was true and it should be false.");
        m_bValidFrustum = false;
      }
    }
  }
  return rc;
}